

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O3

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::CopyFrom
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this,TPZMatrix<double> *mat)

{
  int64_t iVar1;
  TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *cp;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    cp = (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *)
         __dynamic_cast(mat,&TPZMatrix<double>::typeinfo,
                        &TPZDohrPrecond<double,TPZDohrSubstructCondense<double>>::typeinfo,0);
    if (cp != (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *)0x0) {
      TPZMatrix<double>::operator=(&this->super_TPZMatrix<double>,(TPZMatrix<double> *)cp);
      if (cp != this) {
        std::__cxx11::
        list<TPZAutoPointer<TPZDohrSubstructCondense<double>>,std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>>>>
        ::
        _M_assign_dispatch<std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>>>>
                  ((list<TPZAutoPointer<TPZDohrSubstructCondense<double>>,std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>>>>
                    *)&this->fGlobal,
                   (cp->fGlobal).
                   super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next,&cp->fGlobal);
      }
      this->fNumThreads = cp->fNumThreads;
      iVar1 = cp->fNumCoarse;
      this->fCoarse = cp->fCoarse;
      this->fNumCoarse = iVar1;
      TPZAutoPointer<TPZDohrAssembly<double>_>::operator=(&this->fAssemble,&cp->fAssemble);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZDohrPrecond<double, TPZDohrSubstructCondense<double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double, TSubStruct = TPZDohrSubstructCondense<double>]"
             ,0xa7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SubStruct/tpzdohrprecond.h"
             ,0x50);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }